

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlAttrPtr xmlCopyPropList(xmlNodePtr target,xmlAttrPtr cur)

{
  xmlAttrPtr pxVar1;
  xmlAttrPtr pxVar2;
  xmlAttrPtr q;
  xmlAttrPtr p;
  xmlAttrPtr ret;
  xmlAttrPtr cur_local;
  xmlNodePtr target_local;
  
  p = (xmlAttrPtr)0x0;
  q = (xmlAttrPtr)0x0;
  ret = cur;
  if ((target == (xmlNodePtr)0x0) || (target->type == XML_ELEMENT_NODE)) {
    for (; ret != (xmlAttrPtr)0x0; ret = ret->next) {
      pxVar2 = xmlCopyProp(target,ret);
      if (pxVar2 == (xmlAttrPtr)0x0) {
        return (xmlAttrPtr)0x0;
      }
      pxVar1 = pxVar2;
      if (q != (xmlAttrPtr)0x0) {
        q->next = pxVar2;
        pxVar2->prev = q;
        pxVar1 = p;
      }
      p = pxVar1;
      q = pxVar2;
    }
    target_local = (xmlNodePtr)p;
  }
  else {
    target_local = (xmlNodePtr)0x0;
  }
  return (xmlAttrPtr)target_local;
}

Assistant:

xmlAttrPtr
xmlCopyPropList(xmlNodePtr target, xmlAttrPtr cur) {
    xmlAttrPtr ret = NULL;
    xmlAttrPtr p = NULL,q;

    if ((target != NULL) && (target->type != XML_ELEMENT_NODE))
        return(NULL);
    while (cur != NULL) {
        q = xmlCopyProp(target, cur);
	if (q == NULL)
	    return(NULL);
	if (p == NULL) {
	    ret = p = q;
	} else {
	    p->next = q;
	    q->prev = p;
	    p = q;
	}
	cur = cur->next;
    }
    return(ret);
}